

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# onesided.c
# Opt level: O2

Integer gai_correct_strided_patch(Integer ndim,Integer *lo,Integer *skip,Integer *plo,Integer *phi)

{
  long lVar1;
  long lVar2;
  long lVar3;
  Integer IVar4;
  long lVar5;
  
  lVar3 = 0;
  if (ndim < 1) {
    ndim = lVar3;
  }
  do {
    if (ndim == lVar3) {
      return 1;
    }
    IVar4 = plo[lVar3];
    lVar5 = lo[lVar3];
    lVar2 = skip[lVar3];
    lVar1 = (IVar4 - lVar5) % lVar2;
    if (lVar1 != 0) {
      IVar4 = (lVar2 + IVar4) - lVar1;
      plo[lVar3] = IVar4;
      lVar5 = lo[lVar3];
      lVar2 = skip[lVar3];
    }
    lVar1 = phi[lVar3];
    lVar2 = (lVar1 - lVar5) % lVar2;
    if (lVar2 != 0) {
      lVar1 = lVar1 - lVar2;
      phi[lVar3] = lVar1;
      IVar4 = plo[lVar3];
    }
    lVar3 = lVar3 + 1;
  } while (IVar4 <= lVar1);
  return 0;
}

Assistant:

Integer gai_correct_strided_patch(Integer ndim,
                                  Integer *lo,
                                  Integer *skip,
                                  Integer *plo,
                                  Integer *phi)
{
  Integer i, delta;
  for (i=0; i<ndim; i++) {
    delta = plo[i]-lo[i];
    if (delta%skip[i] != 0) {
      plo[i] = plo[i] - delta%skip[i] + skip[i];
    }
    delta = phi[i]-lo[i];
    if (delta%skip[i] != 0) {
      phi[i] = phi[i] - delta%skip[i];
    }
    if (phi[i]<plo[i]) return 0;
  }
  return 1;
}